

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O0

DdNode * cuddZddIte(DdManager *dd,DdNode *f,DdNode *g,DdNode *h)

{
  DdHalfWord id;
  DdNode *pDVar1;
  DdNode *T;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  DdNode *local_b0;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  DdHalfWord local_90;
  int index;
  uint top;
  uint v;
  uint toph;
  uint topg;
  uint topf;
  DdNode *e;
  DdNode *t;
  DdNode *Hvn;
  DdNode *Hv;
  DdNode *Gvn;
  DdNode *Gv;
  DdNode *r;
  DdNode *empty;
  DdNode *tautology;
  DdNode *h_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  Hvn = dd->zero;
  dd_local = (DdManager *)h;
  if (f != Hvn) {
    if (f->index == 0x7fffffff) {
      local_94 = f->index;
    }
    else {
      local_94 = dd->permZ[f->index];
    }
    if (g->index == 0x7fffffff) {
      local_98 = g->index;
    }
    else {
      local_98 = dd->permZ[g->index];
    }
    if (h->index == 0x7fffffff) {
      local_9c = h->index;
    }
    else {
      local_9c = dd->permZ[h->index];
    }
    if (local_9c < local_98) {
      local_a0 = local_9c;
    }
    else {
      local_a0 = local_98;
    }
    if (local_a0 < local_94) {
      local_a4 = local_a0;
    }
    else {
      local_a4 = local_94;
    }
    if (local_a4 == 0x7fffffff) {
      local_b0 = dd->one;
    }
    else {
      local_b0 = dd->univ[local_a4];
    }
    dd_local = (DdManager *)g;
    if (f != local_b0) {
      tautology = h;
      h_local = g;
      g_local = f;
      f_local = &dd->sentinel;
      zddVarToConst(f,&h_local,&tautology,local_b0,Hvn);
      if (h_local == tautology) {
        dd_local = (DdManager *)h_local;
      }
      else if ((h_local == local_b0) && (tautology == Hvn)) {
        dd_local = (DdManager *)g_local;
      }
      else {
        dd_local = (DdManager *)
                   cuddCacheLookupZdd((DdManager *)f_local,0x4e,g_local,h_local,tautology);
        if (dd_local == (DdManager *)0x0) {
          if (h_local->index == 0x7fffffff) {
            local_b4 = h_local->index;
          }
          else {
            local_b4 = *(uint *)(*(long *)(f_local + 8) + (ulong)h_local->index * 4);
          }
          if (tautology->index == 0x7fffffff) {
            local_b8 = tautology->index;
          }
          else {
            local_b8 = *(uint *)(*(long *)(f_local + 8) + (ulong)tautology->index * 4);
          }
          if (local_b8 < local_b4) {
            local_bc = local_b8;
          }
          else {
            local_bc = local_b4;
          }
          if (local_94 < local_bc) {
            Gv = cuddZddIte((DdManager *)f_local,(g_local->type).kids.E,h_local,tautology);
            if (Gv == (DdNode *)0x0) {
              return (DdNode *)0x0;
            }
          }
          else if (local_bc < local_94) {
            if (local_bc < local_b4) {
              Hv = h_local;
              local_90 = tautology->index;
            }
            else {
              Hv = (h_local->type).kids.E;
              local_90 = h_local->index;
            }
            if (local_bc < local_b8) {
              t = tautology;
            }
            else {
              Hvn = (tautology->type).kids.T;
              t = (tautology->type).kids.E;
            }
            pDVar1 = cuddZddIte((DdManager *)f_local,g_local,Hv,t);
            if (pDVar1 == (DdNode *)0x0) {
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
            Gv = cuddZddGetNode((DdManager *)f_local,local_90,Hvn,pDVar1);
            if (Gv == (DdNode *)0x0) {
              Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar1);
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
          }
          else {
            id = g_local->index;
            if (local_bc < local_b4) {
              Hv = h_local;
              Gvn = Hvn;
            }
            else {
              Gvn = (h_local->type).kids.T;
              Hv = (h_local->type).kids.E;
            }
            if (local_bc < local_b8) {
              t = tautology;
            }
            else {
              Hvn = (tautology->type).kids.T;
              t = (tautology->type).kids.E;
            }
            pDVar1 = cuddZddIte((DdManager *)f_local,(g_local->type).kids.E,Hv,t);
            if (pDVar1 == (DdNode *)0x0) {
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
            T = cuddZddIte((DdManager *)f_local,(g_local->type).kids.T,Gvn,Hvn);
            if (T == (DdNode *)0x0) {
              Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar1);
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + 1;
            Gv = cuddZddGetNode((DdManager *)f_local,id,T,pDVar1);
            if (Gv == (DdNode *)0x0) {
              Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar1);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,T);
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + -1;
            *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
          }
          cuddCacheInsert((DdManager *)f_local,0x4e,g_local,h_local,tautology,Gv);
          dd_local = (DdManager *)Gv;
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddZddIte(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    DdNode *tautology, *empty;
    DdNode *r,*Gv,*Gvn,*Hv,*Hvn,*t,*e;
    unsigned int topf,topg,toph,v,top;
    int index;

    statLine(dd);
    /* Trivial cases. */
    /* One variable cases. */
    if (f == (empty = DD_ZERO(dd))) {   /* ITE(0,G,H) = H */
        return(h);
    }
    topf = cuddIZ(dd,f->index);
    topg = cuddIZ(dd,g->index);
    toph = cuddIZ(dd,h->index);
    v = ddMin(topg,toph);
    top  = ddMin(topf,v);

    tautology = (top == CUDD_MAXINDEX) ? DD_ONE(dd) : dd->univ[top];
    if (f == tautology) {                       /* ITE(1,G,H) = G */
        return(g);
    }

    /* From now on, f is known to not be a constant. */
    zddVarToConst(f,&g,&h,tautology,empty);

    /* Check remaining one variable cases. */
    if (g == h) {                       /* ITE(F,G,G) = G */
        return(g);
    }

    if (g == tautology) {                       /* ITE(F,1,0) = F */
        if (h == empty) return(f);
    }

    /* Check cache. */
    r = cuddCacheLookupZdd(dd,DD_ZDD_ITE_TAG,f,g,h);
    if (r != NULL) {
        return(r);
    }

    /* Recompute these because they may have changed in zddVarToConst. */
    topg = cuddIZ(dd,g->index);
    toph = cuddIZ(dd,h->index);
    v = ddMin(topg,toph);

    if (topf < v) {
        r = cuddZddIte(dd,cuddE(f),g,h);
        if (r == NULL) return(NULL);
    } else if (topf > v) {
        if (topg > v) {
            Gvn = g;
            index = h->index;
        } else {
            Gvn = cuddE(g);
            index = g->index;
        }
        if (toph > v) {
            Hv = empty; Hvn = h;
        } else {
            Hv = cuddT(h); Hvn = cuddE(h);
        }
        e = cuddZddIte(dd,f,Gvn,Hvn);
        if (e == NULL) return(NULL);
        cuddRef(e);
        r = cuddZddGetNode(dd,index,Hv,e);
        if (r == NULL) {
            Cudd_RecursiveDerefZdd(dd,e);
            return(NULL);
        }
        cuddDeref(e);
    } else {
        index = f->index;
        if (topg > v) {
            Gv = empty; Gvn = g;
        } else {
            Gv = cuddT(g); Gvn = cuddE(g);
        }
        if (toph > v) {
            Hv = empty; Hvn = h;
        } else {
            Hv = cuddT(h); Hvn = cuddE(h);
        }
        e = cuddZddIte(dd,cuddE(f),Gvn,Hvn);
        if (e == NULL) return(NULL);
        cuddRef(e);
        t = cuddZddIte(dd,cuddT(f),Gv,Hv);
        if (t == NULL) {
            Cudd_RecursiveDerefZdd(dd,e);
            return(NULL);
        }
        cuddRef(t);
        r = cuddZddGetNode(dd,index,t,e);
        if (r == NULL) {
            Cudd_RecursiveDerefZdd(dd,e);
            Cudd_RecursiveDerefZdd(dd,t);
            return(NULL);
        }
        cuddDeref(t);
        cuddDeref(e);
    }

    cuddCacheInsert(dd,DD_ZDD_ITE_TAG,f,g,h,r);

    return(r);

}